

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRandomFragmentOpTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::RandomFragmentOpCase::iterate(RandomFragmentOpCase *this)

{
  CallLogWrapper *this_00;
  undefined8 *puVar1;
  int *piVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  TestLog *pTVar6;
  QuadRenderer *this_01;
  ReferenceQuadRenderer *this_02;
  RenderContext *context;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  int iVar11;
  deUint32 dVar12;
  int x;
  int y;
  GLenum GVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  MessageBuilder *pMVar16;
  int iVar17;
  uint face;
  char *pcVar18;
  int iVar19;
  long lVar20;
  pointer pRVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  ScopedLogSection iterSection;
  Vec4 clearColor;
  vector<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  commands;
  ConstPixelBufferAccess local_2e0;
  UVec4 threshold;
  Surface referenceImg;
  Surface renderedImg;
  PixelBufferAccess local_260;
  PixelBufferAccess local_238;
  PixelBufferAccess local_210;
  Random rnd;
  FragmentOperationState refState;
  PixelBufferAccess local_58;
  long lVar14;
  
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar8);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar15->m_numSamples;
  dVar9 = deInt32Hash(this->m_seed);
  dVar10 = deInt32Hash(this->m_iterNdx);
  iVar11 = tcu::CommandLine::getBaseSeed
                     (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_cmdLine);
  dVar12 = deInt32Hash(iVar11);
  deRandom_init(&rnd.m_rnd,dVar9 ^ dVar10 ^ dVar12);
  iVar11 = (this->m_refColorBuffer->m_size).m_data[0];
  iVar23 = (this->m_refColorBuffer->m_size).m_data[1];
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  x = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar15->m_width - iVar11);
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  y = de::Random::getInt((Random *)&rnd.m_rnd,0,pRVar15->m_height - iVar23);
  tcu::Surface::Surface(&renderedImg,iVar11,iVar23);
  tcu::Surface::Surface(&referenceImg,iVar11,iVar23);
  tcu::Vector<float,_4>::Vector(&clearColor,(Vector<float,_4> *)CLEAR_COLOR);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"Iteration",(allocator<char> *)&local_58);
  de::toString<int>((string *)&threshold,&this->m_iterNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&refState,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&threshold);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Iteration ",(allocator<char> *)&commands);
  de::toString<int>((string *)&local_238,&this->m_iterNdx);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_238);
  tcu::ScopedLogSection::ScopedLogSection
            (&iterSection,pTVar6,(string *)&refState,(string *)&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&refState);
  std::__cxx11::string::~string((string *)&threshold);
  std::__cxx11::string::~string((string *)&local_2e0);
  commands.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::InteractionTestUtil::computeRandomRenderCommands
            (&rnd,(ApiType)0x2,3,iVar11,iVar23,&commands);
  (**(code **)(lVar14 + 0x4e8))(0xc11);
  (**(code **)(lVar14 + 0x238))(1,1,1);
  (**(code **)(lVar14 + 0x4a8))(1);
  (**(code **)(lVar14 + 0x12d8))(0xffffffffffffffff);
  this_00 = &this->m_callLogWrapper;
  glu::CallLogWrapper::glClearColor
            (this_00,clearColor.m_data[0],clearColor.m_data[1],clearColor.m_data[2],
             clearColor.m_data[3]);
  glu::CallLogWrapper::glClearDepthf(this_00,1.0);
  glu::CallLogWrapper::glClearStencil(this_00,0);
  glu::CallLogWrapper::glClear(this_00,0x4500);
  glu::CallLogWrapper::glViewport(this_00,x,y,iVar11,iVar23);
  piVar2 = &refState.scissorRectangle.bottom;
  for (pRVar21 = commands.
                 super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar21 !=
      commands.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar21 = pRVar21 + 1) {
    if ((pRVar21->state).scissorTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xc11);
      glu::CallLogWrapper::glScissor
                (this_00,(pRVar21->state).scissorRectangle.left + x,
                 (pRVar21->state).scissorRectangle.bottom + y,
                 (pRVar21->state).scissorRectangle.width,(pRVar21->state).scissorRectangle.height);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xc11);
    }
    if ((pRVar21->state).stencilTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xb90);
      for (lVar20 = 0xd0; lVar20 != 0x108; lVar20 = lVar20 + 0x1c) {
        face = lVar20 == 0xec | 0x404;
        glu::CallLogWrapper::glStencilFuncSeparate
                  (this_00,face,*(GLenum *)((long)(&(pRVar21->quad).posA + -3) + lVar20),
                   *(GLint *)((long)(pRVar21->quad).posA.m_data + lVar20 + -0x14),
                   *(GLuint *)((long)(&(pRVar21->quad).posA + -2) + lVar20));
        glu::CallLogWrapper::glStencilOpSeparate
                  (this_00,face,*(GLenum *)((long)(pRVar21->quad).posA.m_data + lVar20 + -0xc),
                   *(GLenum *)((long)(&(pRVar21->quad).posA + -1) + lVar20),
                   *(GLenum *)((long)(pRVar21->quad).posA.m_data + lVar20 + -4));
        glu::CallLogWrapper::glStencilMaskSeparate
                  (this_00,face,*(GLuint *)((long)(pRVar21->quad).posA.m_data + lVar20));
      }
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xb90);
    }
    if ((pRVar21->state).depthTestEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xb71);
      glu::CallLogWrapper::glDepthFunc(this_00,(pRVar21->state).depthFunc);
      glu::CallLogWrapper::glDepthMask(this_00,(pRVar21->state).depthWriteMask);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xb71);
    }
    if ((pRVar21->state).blendEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xbe2);
      glu::CallLogWrapper::glBlendEquationSeparate
                (this_00,(pRVar21->state).blendRGBState.equation,
                 (pRVar21->state).blendAState.equation);
      glu::CallLogWrapper::glBlendFuncSeparate
                (this_00,(pRVar21->state).blendRGBState.srcFunc,
                 (pRVar21->state).blendRGBState.dstFunc,(pRVar21->state).blendAState.srcFunc,
                 (pRVar21->state).blendAState.dstFunc);
      glu::CallLogWrapper::glBlendColor
                (this_00,(pRVar21->state).blendColor.m_data[0],(pRVar21->state).blendColor.m_data[1]
                 ,(pRVar21->state).blendColor.m_data[2],(pRVar21->state).blendColor.m_data[3]);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xbe2);
    }
    if ((pRVar21->state).ditherEnabled == true) {
      glu::CallLogWrapper::glEnable(this_00,0xbd0);
    }
    else {
      glu::CallLogWrapper::glDisable(this_00,0xbd0);
    }
    glu::CallLogWrapper::glColorMask
              (this_00,(pRVar21->state).colorMask.m_data[0],(pRVar21->state).colorMask.m_data[1],
               (pRVar21->state).colorMask.m_data[2],(pRVar21->state).colorMask.m_data[3]);
    refState._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar2);
    std::operator<<((ostream *)piVar2,"// Quad: ");
    tcu::operator<<((ostream *)piVar2,(Vector<int,_2> *)pRVar21);
    std::operator<<((ostream *)piVar2," -> ");
    tcu::operator<<((ostream *)piVar2,&(pRVar21->quad).posB);
    std::operator<<((ostream *)piVar2,", color: [");
    tcu::operator<<((ostream *)piVar2,(pRVar21->quad).color);
    std::operator<<((ostream *)piVar2,", ");
    tcu::operator<<((ostream *)piVar2,(pRVar21->quad).color + 1);
    std::operator<<((ostream *)piVar2,", ");
    tcu::operator<<((ostream *)piVar2,(pRVar21->quad).color + 2);
    std::operator<<((ostream *)piVar2,", ");
    tcu::operator<<((ostream *)piVar2,(pRVar21->quad).color + 3);
    std::operator<<((ostream *)piVar2,"]");
    std::operator<<((ostream *)piVar2,", depth: [");
    pMVar16 = tcu::MessageBuilder::operator<<((MessageBuilder *)&refState,(pRVar21->quad).depth);
    std::operator<<((ostream *)&pMVar16->m_str,", ");
    pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(pRVar21->quad).depth + 1);
    std::operator<<((ostream *)&pMVar16->m_str,", ");
    pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(pRVar21->quad).depth + 2);
    std::operator<<((ostream *)&pMVar16->m_str,", ");
    pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(pRVar21->quad).depth + 3);
    std::operator<<((ostream *)&pMVar16->m_str,"]");
    tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar2);
    this_01 = this->m_renderer;
    deqp::gls::FragmentOpUtil::Quad::Quad((Quad *)&refState);
    for (lVar20 = 0x10; lVar20 != 0x50; lVar20 = lVar20 + 0x10) {
      puVar1 = (undefined8 *)((long)(pRVar21->quad).posA.m_data + lVar20);
      uVar4 = puVar1[1];
      *(undefined8 *)((long)refState.stencilStates + lVar20 + -0x18) = *puVar1;
      *(undefined8 *)((long)refState.stencilStates + lVar20 + -0x10) = uVar4;
    }
    uVar4 = *(undefined8 *)(pRVar21->quad).posB.m_data;
    uVar5 = *(undefined8 *)(pRVar21->quad).posA.m_data;
    iVar22 = (int)uVar4;
    iVar17 = (int)uVar5;
    iVar11 = (int)((ulong)uVar5 >> 0x20);
    auVar24._0_4_ = -(uint)(iVar22 < iVar17);
    iVar23 = (int)((ulong)uVar4 >> 0x20);
    auVar24._4_4_ = -(uint)(iVar23 < iVar11);
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._4_4_;
    refState._0_16_ = auVar24 & _DAT_005bf7b0 | ~auVar24 & _DAT_005bf290;
    for (lVar20 = 0x24; lVar20 != 0x28; lVar20 = lVar20 + 1) {
      fVar3 = (float)(pRVar21->quad).posA.m_data[lVar20];
      *(float *)((long)refState.stencilStates + lVar20 * 4 + -0x18) = fVar3 + fVar3 + -1.0;
    }
    iVar19 = iVar17 - iVar22;
    if (iVar17 < iVar22) {
      iVar22 = iVar17;
    }
    iVar17 = iVar11 - iVar23;
    if (iVar11 < iVar23) {
      iVar23 = iVar11;
    }
    iVar11 = -iVar17;
    if (0 < iVar17) {
      iVar11 = iVar17;
    }
    iVar17 = -iVar19;
    if (0 < iVar19) {
      iVar17 = iVar19;
    }
    (**(code **)(lVar14 + 0x1a00))(iVar22 + x,iVar23 + y,iVar17 + 1,iVar11 + 1);
    deqp::gls::FragmentOpUtil::QuadRenderer::render(this_01,(Quad *)&refState);
  }
  GVar13 = glu::CallLogWrapper::glGetError(this_00);
  (**(code **)(lVar14 + 0x650))();
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&refState,this->m_refColorBuffer);
  tcu::clear((PixelBufferAccess *)&refState,&clearColor);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&refState,this->m_refDepthBuffer);
  tcu::clearDepth((PixelBufferAccess *)&refState,1.0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&refState,this->m_refStencilBuffer);
  tcu::clearStencil((PixelBufferAccess *)&refState,0);
  for (pRVar21 = commands.
                 super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pRVar21 !=
      commands.
      super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish; pRVar21 = pRVar21 + 1) {
    rr::FragmentOperationState::FragmentOperationState(&refState);
    pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
    translateState(&pRVar21->state,&refState,pRVar15);
    this_02 = this->m_refRenderer;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&threshold,this->m_refColorBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess
              ((PixelBufferAccess *)&local_2e0,(PixelBufferAccess *)&threshold);
    tcu::TextureLevel::getAccess(&local_210,this->m_refDepthBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_260,&local_210);
    tcu::TextureLevel::getAccess(&local_58,this->m_refStencilBuffer);
    deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_238,&local_58);
    deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
              (this_02,(PixelBufferAccess *)&local_2e0,&local_260,&local_238,&pRVar21->quad,
               &refState);
  }
  tcu::Surface::getAccess((PixelBufferAccess *)&refState,&referenceImg);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_2e0,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&refState,(EVP_PKEY_CTX *)&local_2e0);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&refState,&renderedImg);
  glu::readPixels(context,x,y,(PixelBufferAccess *)&refState);
  iVar11 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar11;
  getCompareThreshold((RandomFragmentOpCase *)&threshold);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (iVar8 < 2) {
    tcu::Surface::getAccess((PixelBufferAccess *)&refState,&referenceImg);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2e0,&renderedImg);
    bVar7 = tcu::intThresholdCompare
                      (pTVar6,"CompareResult","Image Comparison Result",
                       (ConstPixelBufferAccess *)&refState,&local_2e0,&threshold,COMPARE_LOG_RESULT)
    ;
  }
  else {
    tcu::Surface::getAccess((PixelBufferAccess *)&refState,&referenceImg);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_2e0,&renderedImg);
    bVar7 = tcu::bilinearCompare
                      (pTVar6,"CompareResult","Image Comparison Result",
                       (ConstPixelBufferAccess *)&refState,&local_2e0,
                       (RGBA)(threshold.m_data[1] << 8 | threshold.m_data[0] |
                             threshold.m_data[2] << 0x10 | threshold.m_data[3] << 0x18),
                       COMPARE_LOG_RESULT);
  }
  piVar2 = &refState.scissorRectangle.bottom;
  refState._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar2);
  pcVar18 = "  FAILED!";
  if (bVar7 != false) {
    pcVar18 = "  Passed.";
  }
  std::operator<<((ostream *)piVar2,pcVar18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&refState,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar2);
  if ((bVar7 & GVar13 == 0) == 0) {
    pcVar18 = "Image comparison failed";
    if (bVar7 != false) {
      pcVar18 = "GL error";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               pcVar18);
  }
  std::
  _Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
  ::~_Vector_base(&commands.
                   super__Vector_base<deqp::gls::InteractionTestUtil::RenderCommand,_std::allocator<deqp::gls::InteractionTestUtil::RenderCommand>_>
                 );
  tcu::ScopedLogSection::~ScopedLogSection(&iterSection);
  tcu::Surface::~Surface(&referenceImg);
  tcu::Surface::~Surface(&renderedImg);
  return (uint)(byte)((iVar11 < 10 && GVar13 == 0) & bVar7);
}

Assistant:

RandomFragmentOpCase::IterateResult RandomFragmentOpCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				isMSAA			= m_context.getRenderTarget().getNumSamples() > 1;
	const deUint32			iterSeed		= deUint32Hash(m_seed) ^ deInt32Hash(m_iterNdx) ^ deInt32Hash(m_testCtx.getCommandLine().getBaseSeed());
	de::Random				rnd				(iterSeed);

	const int				width			= m_refColorBuffer->getWidth();
	const int				height			= m_refColorBuffer->getHeight();
	const int				viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
	const int				viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

	tcu::Surface			renderedImg		(width, height);
	tcu::Surface			referenceImg	(width, height);

	const Vec4				clearColor		= CLEAR_COLOR;
	const float				clearDepth		= CLEAR_DEPTH;
	const int				clearStencil	= CLEAR_STENCIL;

	bool					gotError		= false;

	const tcu::ScopedLogSection	iterSection	(m_testCtx.getLog(), std::string("Iteration") + de::toString(m_iterNdx), std::string("Iteration ") + de::toString(m_iterNdx));

	// Compute randomized rendering commands.
	vector<RenderCommand> commands;
	computeRandomRenderCommands(rnd, glu::ApiType::es(2,0), NUM_CALLS_PER_ITERATION, width, height, commands);

	// Reset default fragment state.
	gl.disable(GL_SCISSOR_TEST);
	gl.colorMask(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
	gl.depthMask(GL_TRUE);
	gl.stencilMask(~0u);

	// Render using GL.
	m_callLogWrapper.glClearColor(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	m_callLogWrapper.glClearDepthf(clearDepth);
	m_callLogWrapper.glClearStencil(clearStencil);
	m_callLogWrapper.glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_callLogWrapper.glViewport(viewportX, viewportY, width, height);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		setGLState(m_callLogWrapper, cmd->state, viewportX, viewportY);

		if (ENABLE_CALL_LOG)
			m_testCtx.getLog() << TestLog::Message << "// Quad: " << cmd->quad.posA << " -> " << cmd->quad.posB
												   << ", color: [" << cmd->quad.color[0] << ", " << cmd->quad.color[1] << ", " << cmd->quad.color[2] << ", " << cmd->quad.color[3] << "]"
												   << ", depth: [" << cmd->quad.depth[0] << ", " << cmd->quad.depth[1] << ", " << cmd->quad.depth[2] << ", " << cmd->quad.depth[3] << "]"
								<< TestLog::EndMessage;

		renderQuad(gl, *m_renderer, cmd->quad, viewportX, viewportY);
	}

	// Check error.
	if (m_callLogWrapper.glGetError() != GL_NO_ERROR)
		gotError = true;

	gl.flush();

	// Render reference while GPU is doing work.
	tcu::clear			(m_refColorBuffer->getAccess(),		clearColor);
	tcu::clearDepth		(m_refDepthBuffer->getAccess(),		clearDepth);
	tcu::clearStencil	(m_refStencilBuffer->getAccess(),	clearStencil);

	for (vector<RenderCommand>::const_iterator cmd = commands.begin(); cmd != commands.end(); cmd++)
	{
		rr::FragmentOperationState refState;
		translateState(cmd->state, refState, m_context.getRenderTarget());
		m_refRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refDepthBuffer->getAccess()),
							  gls::FragmentOpUtil::getMultisampleAccess(m_refStencilBuffer->getAccess()),
							  cmd->quad, refState);
	}

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	m_iterNdx += 1;

	// Compare to reference.
	bool				isLastIter	= m_iterNdx >= NUM_ITERATIONS_PER_CASE;
	const tcu::UVec4	threshold	= getCompareThreshold();
	bool				compareOk;

	if (isMSAA)
	{
		// in MSAA cases, the sampling points could be anywhere in the pixel and we could
		// even have multiple samples that are combined in resolve. Allow arbitrary sample
		// positions by using bilinearCompare.
		compareOk = tcu::bilinearCompare(m_testCtx.getLog(),
										 "CompareResult",
										 "Image Comparison Result",
										 referenceImg.getAccess(),
										 renderedImg.getAccess(),
										 tcu::RGBA(threshold.x(), threshold.y(), threshold.z(), threshold.w()),
										 tcu::COMPARE_LOG_RESULT);
	}
	else
		compareOk = tcu::intThresholdCompare(m_testCtx.getLog(),
											 "CompareResult",
											 "Image Comparison Result",
											 referenceImg.getAccess(),
											 renderedImg.getAccess(),
											 threshold,
											 tcu::COMPARE_LOG_RESULT);

	m_testCtx.getLog() << TestLog::Message << (compareOk ? "  Passed." : "  FAILED!") << TestLog::EndMessage;

	if (!compareOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	else if (gotError)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GL error");

	if (compareOk && !gotError && !isLastIter)
		return CONTINUE;
	else
		return STOP;
}